

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,char c)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  basic_substring<char> bVar7;
  basic_substring<char> local_28;
  
  pcVar4 = (char *)this->len;
  pcVar6 = pcVar4;
  if (this->str != (char *)0x0 && pcVar4 != (char *)0x0) {
    do {
      pcVar5 = pcVar6 + -1;
      if (pcVar6 == (char *)0x0) {
        pcVar5 = (char *)0x0;
        pcVar6 = (char *)0xffffffffffffffff;
        break;
      }
      pcVar1 = pcVar6 + (long)(this->str + -1);
      pcVar6 = pcVar5;
    } while (*pcVar1 == c);
    if (pcVar6 != (char *)0xffffffffffffffff) {
      pcVar5 = pcVar6 + 1;
      if (pcVar5 != (char *)0xffffffffffffffff && pcVar4 <= pcVar6) {
        if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar7 = (basic_substring<char>)(*pcVar2)();
          return bVar7;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (pcVar5 == (char *)0xffffffffffffffff) {
        pcVar5 = (char *)this->len;
      }
      if ((char *)this->len < pcVar5) {
        if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar7 = (basic_substring<char>)(*pcVar2)();
          return bVar7;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_28,this->str,(size_t)pcVar5);
      pcVar4 = local_28.str;
      pcVar5 = (char *)local_28.len;
    }
    if (pcVar6 != (char *)0xffffffffffffffff) goto LAB_001fa297;
  }
  pcVar4 = this->str;
  pcVar5 = (char *)0x0;
LAB_001fa297:
  bVar7.len = (size_t)pcVar5;
  bVar7.str = pcVar4;
  return bVar7;
}

Assistant:

basic_substring trimr(const C c) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(c, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }